

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t rows,size_t initCol,size_t cols
          )

{
  size_t sVar1;
  size_t toBeAdded;
  size_t local_58;
  
  if (rows != 0) {
    local_58 = 0;
    do {
      if (cols != 0) {
        sVar1 = cols;
        toBeAdded = initCol;
        do {
          addNonZero(this,&this->m_jacobianNZRows,this->m_jacobianNonZeros,local_58 + initRow);
          addNonZero(this,&this->m_jacobianNZCols,this->m_jacobianNonZeros,toBeAdded);
          this->m_jacobianNonZeros = this->m_jacobianNonZeros + 1;
          toBeAdded = toBeAdded + 1;
          sVar1 = sVar1 - 1;
        } while (sVar1 != 0);
      }
      local_58 = local_58 + 1;
    } while (local_58 != rows);
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t rows, size_t initCol, size_t cols){
                for (size_t i = 0; i < rows; ++i){
                    for (size_t j = 0; j < cols; ++j){
                        addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + i);
                        addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + j);
                        m_jacobianNonZeros++;
                    }
                }
            }